

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O1

ssize_t AbstractFileBuffer::read(int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ByteBuffer *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  FileBufferException *this_00;
  undefined4 in_register_0000003c;
  long *plVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  CustomException anon_var_0;
  QString local_90 [4];
  
  plVar8 = (long *)CONCAT44(in_register_0000003c,__fd);
  pvVar3 = (void *)(**(code **)(*plVar8 + 0x80))();
  if (__buf < pvVar3) {
    __buf = pvVar3;
  }
  do {
    this = (ByteBuffer *)operator_new(0x28);
    ByteBuffer::ByteBuffer(this,(bufsize_t)__buf,2);
    if (this != (ByteBuffer *)0x0) break;
  } while (__buf != (void *)0x0);
  iVar1 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[3])(this);
  iVar2 = (*(this->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[2])(this);
  if ((CONCAT44(extraout_var,iVar1) == 0) || (CONCAT44(extraout_var_00,iVar2) == 0)) {
    this_00 = (FileBufferException *)__cxa_allocate_exception(0x48);
    QString::QString(local_90,"Cannot allocate buffer");
    FileBufferException::FileBufferException(this_00,local_90);
    __cxa_throw(this_00,&FileBufferException::typeinfo,CustomException::~CustomException);
  }
  lVar9 = 0;
  lVar10 = 0;
  do {
    uVar4 = (**(code **)(*plVar8 + 0x78))(plVar8);
    if (CONCAT44(extraout_var_00,iVar2) - 1U <= uVar4) break;
    lVar5 = QIODevice::read((char *)plVar8,CONCAT44(extraout_var,iVar1) + lVar9);
    lVar6 = (**(code **)(*plVar8 + 0x78))(plVar8);
    lVar7 = lVar10;
    if (lVar10 != lVar6) {
      lVar7 = (**(code **)(*plVar8 + 0x78))();
    }
    lVar9 = lVar9 + lVar5;
    bVar11 = lVar10 != lVar6;
    lVar10 = lVar7;
  } while (bVar11);
  Logger::append(D_INFO,"Read size: %lX",lVar9);
  return (ssize_t)this;
}

Assistant:

ByteBuffer* AbstractFileBuffer::read(QFile &fIn, bufsize_t minBufSize, const bool allowTruncate) //throws exceptions
{
    bufsize_t readableSize = getReadableSize(fIn);
    bufsize_t allocSize = (readableSize < minBufSize) ? minBufSize : readableSize;

    ByteBuffer *bufferedFile = NULL;
    do {
        try {
            bufferedFile = new ByteBuffer(allocSize); //throws exceptions
        }
        catch (CustomException)
        {
            if (!allowTruncate) throw;
            allocSize /= 2;
        }
    } while(!bufferedFile && allocSize);

    char *content = (char*) bufferedFile->getContent();
    bufsize_t contentSize = bufferedFile->getContentSize();

    if (!content || !contentSize) throw FileBufferException("Cannot allocate buffer");
    //printf("Reading...%lx , BUFSIZE_MAX = %lx\n", allocSize, BUFSIZE_MAX);

    bufsize_t readSize = 0;
    offset_t prevOffset = 0;
    offset_t maxOffset = contentSize - 1;

    while (offset_t(fIn.pos()) < maxOffset) {

        bufsize_t maxSize = contentSize - readSize;
        if (maxSize > FILEVIEW_MAXSIZE) maxSize = FILEVIEW_MAXSIZE;

        readSize += fIn.read(content + readSize,  maxSize);
        if (prevOffset == fIn.pos()) break; //cannot read more!
        prevOffset = fIn.pos();
    }
    Logger::append(Logger::D_INFO,
        "Read size: %lX",
        static_cast<unsigned long>(readSize)
    );
    return bufferedFile;
}